

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_listener.hpp
# Opt level: O1

void __thiscall zmq::tipc_listener_t::~tipc_listener_t(tipc_listener_t *this)

{
  stream_listener_base_t::~stream_listener_base_t(&this->super_stream_listener_base_t);
  operator_delete(this,0x5c8);
  return;
}

Assistant:

class tipc_listener_t ZMQ_FINAL : public stream_listener_base_t
{
  public:
    tipc_listener_t (zmq::io_thread_t *io_thread_,
                     zmq::socket_base_t *socket_,
                     const options_t &options_);

    //  Set address to listen on.
    int set_local_address (const char *addr_);

  protected:
    std::string get_socket_name (fd_t fd_,
                                 socket_end_t socket_end_) const ZMQ_FINAL;

  private:
    //  Handlers for I/O events.
    void in_event () ZMQ_FINAL;

    //  Accept the new connection. Returns the file descriptor of the
    //  newly created connection. The function may return retired_fd
    //  if the connection was dropped while waiting in the listen backlog.
    fd_t accept ();

    // Address to listen on
    tipc_address_t _address;

    ZMQ_NON_COPYABLE_NOR_MOVABLE (tipc_listener_t)
}